

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O2

size_t __thiscall bidfx_public_api::tools::ByteBuffer::WriteFloat(ByteBuffer *this,float value)

{
  int iVar1;
  undefined4 extraout_var;
  uchar bytes [4];
  
  iVar1 = (*(this->super_InputStream)._vptr_InputStream[3])(this,bytes,4);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t ByteBuffer::WriteFloat(const float value)
{
    uint32_t i = *(uint32_t*)&value;
    unsigned char bytes[4];
    bytes[0] = (unsigned char) (i >> 24);
    bytes[1] = (unsigned char) (i >> 16);
    bytes[2] = (unsigned char) (i >> 8);
    bytes[3] = (unsigned char) i;
    return WriteBytes(bytes, 4);
}